

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O3

endpoint_type * __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::remote_endpoint
          (endpoint_type *__return_storage_ptr__,reactive_socket_service<asio::ip::tcp> *this,
          implementation_type *impl,error_code *ec)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  error_category *peVar4;
  ulong new_size;
  uint tmp_addrlen;
  endpoint_type endpoint;
  socklen_t local_48;
  data_union local_44;
  
  local_44.v6.sin6_scope_id = 0;
  local_44._8_4_ = 0;
  local_44._12_4_ = 0;
  local_44._16_4_ = 0;
  local_44._20_4_ = 0;
  local_44._0_8_ = 2;
  iVar1 = (impl->super_base_implementation_type).socket_;
  if (iVar1 == -1) {
    std::error_code::operator=(ec,bad_descriptor);
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0;
    local_48 = 0x1c;
    iVar2 = getpeername(iVar1,(sockaddr *)&local_44.base,&local_48);
    new_size = (ulong)local_48;
    iVar1 = *piVar3;
    if (system_category()::instance == '\0') {
      remote_endpoint();
    }
    ec->_M_value = iVar1;
    ec->_M_cat = (error_category *)&system_category()::instance;
    if (iVar2 == 0) {
      peVar4 = (error_category *)std::_V2::system_category();
      ec->_M_value = 0;
      ec->_M_cat = peVar4;
      ip::basic_endpoint<asio::ip::tcp>::resize
                ((basic_endpoint<asio::ip::tcp> *)&local_44.base,new_size);
      *(ulong *)((long)&(__return_storage_ptr__->impl_).data_ + 0xc) =
           CONCAT44(local_44._16_4_,local_44._12_4_);
      *(ulong *)((long)&(__return_storage_ptr__->impl_).data_ + 0x14) =
           CONCAT44(local_44.v6.sin6_scope_id,local_44._20_4_);
      *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = local_44._0_8_;
      *(ulong *)((long)&(__return_storage_ptr__->impl_).data_ + 8) =
           CONCAT44(local_44._12_4_,local_44._8_4_);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->impl_).data_.v6.sin6_scope_id = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = 2;
  return __return_storage_ptr__;
}

Assistant:

endpoint_type remote_endpoint(const implementation_type& impl,
      asio::error_code& ec) const
  {
    endpoint_type endpoint;
    std::size_t addr_len = endpoint.capacity();
    if (socket_ops::getpeername(impl.socket_,
          endpoint.data(), &addr_len, false, ec))
      return endpoint_type();
    endpoint.resize(addr_len);
    return endpoint;
  }